

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O1

Error __thiscall
gerr::Make<fake::ErrArgumentZero,fake::ErrArgumentZero::__PrivateStruct__>
          (gerr *this,__PrivateStruct__ *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Error EVar2;
  shared_ptr<fake::ErrArgumentZero> p;
  undefined1 local_21;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  std::__shared_ptr<fake::ErrArgumentZero,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<fake::ErrArgumentZero>,fake::ErrArgumentZero::__PrivateStruct__>
            ((__shared_ptr<fake::ErrArgumentZero,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (allocator<fake::ErrArgumentZero> *)&local_21,args);
  *(undefined8 *)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  _Var1._M_pi = extraout_RDX;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
  EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Error)EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Error Make(Args&&... args) {
  auto p = std::make_shared<ErrType>(std::forward<Args>(args)...);
  return std::static_pointer_cast<details::IError>(p);
}